

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctsa.c
# Opt level: O3

auto_arima_object auto_arima_init(int *pdqmax,int *PDQmax,int s,int r,int N)

{
  int iVar1;
  int iVar2;
  auto_arima_object paVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  
  iVar11 = 2;
  if (pdqmax == (int *)0x0) {
    uVar12 = 5;
    iVar13 = 2;
    iVar6 = 5;
  }
  else {
    uVar12 = (ulong)(uint)*pdqmax;
    iVar13 = pdqmax[1];
    iVar6 = pdqmax[2];
  }
  if (PDQmax == (int *)0x0) {
    iVar7 = 1;
    iVar5 = 2;
  }
  else {
    iVar11 = *PDQmax;
    iVar7 = PDQmax[1];
    iVar5 = PDQmax[2];
  }
  if ((((0 < N) && (iVar10 = (int)uVar12, -1 < iVar10)) && (-1 < iVar13)) &&
     (((-1 < iVar6 && (-1 < iVar11)) && ((-1 < iVar7 && (-1 < iVar5)))))) {
    iVar8 = iVar6 + iVar10 + iVar11;
    iVar9 = iVar8 + iVar5;
    iVar2 = r + 2 + iVar9;
    iVar1 = iVar2 + N;
    lVar4 = (long)iVar2;
    paVar3 = (auto_arima_object)malloc((lVar4 * lVar4 + (long)iVar1) * 8 + 0x150);
    paVar3->pmax = iVar10;
    paVar3->dmax = iVar13;
    paVar3->qmax = iVar6;
    paVar3->N = N;
    paVar3->s = s;
    paVar3->Pmax = iVar11;
    paVar3->Dmax = iVar7;
    paVar3->Qmax = iVar5;
    paVar3->M = r + 2;
    paVar3->r = r;
    paVar3->retval = 0;
    paVar3->start = 0;
    paVar3->verbose = 0;
    iVar11 = iVar2 * iVar2;
    if (iVar1 + iVar11 != 0 && SCARRY4(iVar1,iVar11) == iVar1 + iVar11 < 0) {
      memset(paVar3 + 1,0,(ulong)(iVar11 + r + iVar9 + N + 1) * 8 + 8);
    }
    paVar3->phi = (double *)(paVar3 + 1);
    paVar3->theta = (double *)(&paVar3[1].N + uVar12 * 2);
    paVar3->PHI = (double *)(&paVar3[1].N + (long)(iVar6 + iVar10) * 2);
    paVar3->THETA = (double *)(&paVar3[1].N + (long)iVar8 * 2);
    paVar3->exog = (double *)(&paVar3[1].N + (long)iVar9 * 2);
    paVar3->res = (double *)(&paVar3[1].N + lVar4 * 2);
    paVar3->vcov = (double *)(&paVar3[1].N + (long)iVar1 * 2);
    paVar3->method = 0;
    paVar3->optmethod = 5;
    paVar3->mean = 0.0;
    paVar3->var = 1.0;
    paVar3->lvcov = iVar11;
    paVar3->ncoeff = iVar2;
    paVar3->stepwise = 1;
    paVar3->num_models = 0x5e;
    paVar3->stationary = 0;
    paVar3->approximation = (uint)(0xc < s || 0x96 < (uint)N);
    paVar3->seasonal = 1;
    paVar3->Order_max = 5;
    paVar3->alpha_test = 0.05;
    paVar3->alpha_seas = 0.05;
    paVar3->imean = 1;
    paVar3->idrift = 1;
    builtin_strncpy(paVar3->test,"kpss",5);
    builtin_strncpy(paVar3->seas,"seas",5);
    builtin_strncpy(paVar3->information_criteria,"aicc",5);
    builtin_strncpy(paVar3->type,"level",6);
    paVar3->p_start = 2;
    paVar3->q_start = 2;
    paVar3->P_start = 1;
    paVar3->Q_start = 1;
    paVar3->Q = 0;
    paVar3->P = 0;
    paVar3->D = 0;
    paVar3->q = 0;
    paVar3->p = 0;
    paVar3->d = 0;
    paVar3->aicc = 0.0;
    paVar3->aic = 0.0;
    paVar3->bic = 0.0;
    return paVar3;
  }
  puts("\n Input Values cannot be Negative. Program Exiting. ");
  exit(-1);
}

Assistant:

auto_arima_object auto_arima_init(int *pdqmax,int *PDQmax,int s, int r, int N) {
	auto_arima_object obj = NULL;
	int pmax,dmax,qmax,Pmax,Dmax,Qmax;
	int i,ncxreg;

	if (pdqmax == NULL) {
		pmax = 5;
		dmax = 2;
		qmax = 5;
	} else {
		pmax = pdqmax[0];
		dmax = pdqmax[1];
		qmax = pdqmax[2];
	}

	if (PDQmax == NULL) {
		Pmax = 2;
		Dmax = 1;
		Qmax = 2;
	} else {
		Pmax = PDQmax[0];
		Dmax = PDQmax[1];
		Qmax = PDQmax[2];
	}

	ncxreg = r + 2;
	if (pmax < 0 || dmax < 0 || qmax < 0 || N <= 0 || Pmax < 0 || Dmax < 0 || Qmax < 0) {
		printf("\n Input Values cannot be Negative. Program Exiting. \n");
		exit(-1);
	}

	obj = (auto_arima_object)malloc(sizeof(struct auto_arima_set) +
	 sizeof(double)* (pmax + qmax + Pmax + Qmax + ncxreg + N) + sizeof(double)* (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg ));

	obj->pmax = pmax;
	obj->dmax = dmax;
	obj->qmax = qmax;
	obj->N = N;
	obj->s = s;
	obj->Pmax = Pmax;
	obj->Dmax = Dmax;
	obj->Qmax = Qmax;
	obj->M = ncxreg;
	obj->r = r;
	obj->retval = 0;
	obj->start = 0;
	obj->verbose = 0;

	for(i = 0; i < (pmax + qmax + Pmax + Qmax + ncxreg + N) + (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg ); ++i ) {
		obj->params[i] = 0.0;
	}

	obj->phi = &obj->params[0];
	obj->theta = &obj->params[pmax];
	obj->PHI = &obj->params[pmax + qmax];
	obj->THETA = &obj->params[pmax + qmax + Pmax];
	obj->exog = &obj->params[pmax + qmax + Pmax + Qmax];
	obj->res = &obj->params[pmax + qmax + Pmax + Qmax + ncxreg];
	obj->vcov = &obj->params[pmax + qmax + Pmax + Qmax + ncxreg + N];


	obj->method = 0;// 0 - MLE, 1 - CSS, 2 - Box-Jenkins
	obj->optmethod = 5; // Default Method is 5
	obj->mean = 0.0;
	obj->var = 1.0;
	obj->lvcov = (pmax + qmax + Pmax + Qmax + ncxreg )*(pmax + qmax + Pmax + Qmax + ncxreg );
	obj->ncoeff = pmax + qmax + Pmax + Qmax + ncxreg ;

	// Set Default Values

	obj->stepwise = 1;
	obj->stationary = 0;
	obj->approximation = (N > 150 || s >  12) ? 1 : 0;
	//obj->approximation = 0;
	obj->Order_max = 5;
	obj->seasonal = 1;
	obj->num_models = 94;
	obj->alpha_test = 0.05;
	obj->alpha_seas = 0.05;
	obj->imean = 1;
	obj->idrift = 1;

	strcpy(obj->test,"kpss");
	strcpy(obj->seas,"seas");
	strcpy(obj->information_criteria,"aicc");
	strcpy(obj->type,"level");

	obj->p_start = 2;
	obj->q_start = 2;
	obj->P_start = 1;
	obj->Q_start = 1;
	
	// Temporary Init
	
	obj->p = obj->d = obj->q = obj->P = obj->D = obj->Q = 0;
	obj->aic = obj->bic = obj->aicc = 0;


	return obj;
}